

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O2

int __thiscall MediaManager::GetTypeFromFile(MediaManager *this,string *str)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  uchar buffer [256];
  
  __stream = fopen((str->_M_dataplus)._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    memset(buffer,0,0x100);
    fread(buffer,1,0x100,__stream);
    fclose(__stream);
    iVar3 = (*(this->super_ITypeManager)._vptr_ITypeManager[1])(this,buffer,0x100);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer,"*\\.rom",0x10);
  bVar2 = std::regex_match<char,std::__cxx11::regex_traits<char>>
                    (pcVar1,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer);
  if (bVar2) {
    iVar3 = 2;
  }
  else {
    pcVar1 = (str->_M_dataplus)._M_p;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer,"*\\.raw",0x10);
    bVar2 = std::regex_match<char,std::__cxx11::regex_traits<char>>
                      (pcVar1,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer);
    if (bVar2) {
      iVar3 = 3;
    }
    else {
      pcVar1 = (str->_M_dataplus)._M_p;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer,"*\\.tap",0x10);
      bVar2 = std::regex_match<char,std::__cxx11::regex_traits<char>>
                        (pcVar1,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer);
      if (bVar2) {
        iVar3 = 4;
      }
      else {
        pcVar1 = (str->_M_dataplus)._M_p;
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer,"*\\.bin",0x10);
        bVar2 = std::regex_match<char,std::__cxx11::regex_traits<char>>
                          (pcVar1,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer,0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer);
        if (bVar2) {
          iVar3 = 6;
        }
        else {
          pcVar1 = (str->_M_dataplus)._M_p;
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer,"*\\.cpr",0x10);
          bVar2 = std::regex_match<char,std::__cxx11::regex_traits<char>>
                            (pcVar1,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer,0
                            );
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)buffer);
          iVar3 = (uint)bVar2 << 3;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int MediaManager::GetTypeFromFile(std::string str)
{
   int return_type = MEDIA_UNDEF;
   // Check buffer
   FILE* file;

   if (fopen_s(&file, str.c_str(), "rb") == 0)
   {
      unsigned char buffer [0x100] = {0};
      // check the 22 first char
      fread(buffer, 1, 0x100, file);
      fclose(file);

      return_type = GetTypeFromBuffer(buffer, 0x100);
   }

   if (return_type == MEDIA_UNDEF)
   {
      // Check file extension

      //if (PathMatchSpec(str.c_str(), _T("*.rom")) == TRUE)
      if (regex_match(str.c_str(), std::regex("*\\.rom")))
      {
         return_type = MEDIA_ROM;
      }
      else //if (PathMatchSpec(str.c_str(), _T("*.raw")) == TRUE)
         if (regex_match(str.c_str(), std::regex("*\\.raw")))
         {
            return_type = MEDIA_DISK;
         }
         else //if (PathMatchSpec(str.c_str(), _T("*.tap")) == TRUE)
            if (regex_match(str.c_str(), std::regex("*\\.tap")))
            {
               return_type = MEDIA_TAPE;
            }
            else //if (PathMatchSpec(str.c_str(), _T("*.bin")) == TRUE)
               if (regex_match(str.c_str(), std::regex("*\\.bin")))
               {
                  return MEDIA_BIN;
               }
               else //if (PathMatchSpec(str.c_str(), _T("*.cpr")) == TRUE)
                  if (regex_match(str.c_str(), std::regex("*\\.cpr")))
                  {
                     return MEDIA_CPR;
                  }
   }

   return return_type;
}